

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void * duckdb_je_b0_alloc_tcache_stack(tsdn_t *tsdn,size_t stack_size)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  ulong uVar3;
  edata_avail_t *ph;
  long lVar4;
  base_t *base;
  int iVar5;
  uint64_t in_RAX;
  edata_t *phn;
  undefined8 *puVar6;
  ulong uVar7;
  size_t size;
  size_t esn;
  uint64_t local_38;
  
  base = b0;
  __mutex = (pthread_mutex_t *)((long)&(b0->mtx).field_0 + 0x48);
  local_38 = in_RAX;
  iVar5 = pthread_mutex_trylock(__mutex);
  if (iVar5 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&base->mtx);
    (base->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(base->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((base->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (base->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(base->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  ph = &base->edata_avail;
  phn = duckdb_je_edata_avail_first(ph);
  if (phn == (edata_t *)0x0) {
    (base->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
    phn = duckdb_je_base_alloc_edata(tsdn,base);
  }
  else {
    duckdb_je_edata_avail_remove(ph,phn);
    (base->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
  if (phn != (edata_t *)0x0) {
    uVar3 = stack_size + 0x10;
    if (uVar3 < 0x1001) {
      size = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[stack_size + 0x17 >> 3]];
    }
    else if (uVar3 < 0x7000000000000001) {
      uVar7 = uVar3 * 2 - 1;
      lVar4 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      uVar7 = 0xf;
      if (6 < (uint)lVar4) {
        uVar7 = ~(-1L << ((char)lVar4 - 3U & 0x3f));
      }
      size = ~uVar7 & uVar3 + uVar7;
    }
    else {
      size = 0;
    }
    puVar6 = (undefined8 *)base_alloc_impl(tsdn,base,size,0x10,&local_38,(size_t *)0x0);
    if (puVar6 != (undefined8 *)0x0) {
      phn->e_addr = puVar6;
      (phn->field_2).e_size_esn = size;
      phn->e_sn = local_38;
      phn->e_bits = phn->e_bits & 0xfffffffffe800fff | 0xe81afff;
      *puVar6 = phn;
      return puVar6 + 2;
    }
    duckdb_je_edata_avail_insert(ph,phn);
  }
  return (void *)0x0;
}

Assistant:

void *
b0_alloc_tcache_stack(tsdn_t *tsdn, size_t stack_size) {
	base_t *base = b0get();
	edata_t *edata = base_alloc_base_edata(tsdn, base);
	if (edata == NULL) {
		return NULL;
	}

	/*
	 * Reserve room for the header, which stores a pointer to the managing
	 * edata_t.  The header itself is located right before the return
	 * address, so that edata can be retrieved on dalloc.  Bump up to usize
	 * to improve reusability -- otherwise the freed stacks will be put back
	 * into the previous size class.
	 */
	size_t esn, alignment, header_size;
	b0_alloc_header_size(&header_size, &alignment);

	size_t alloc_size = sz_s2u(stack_size + header_size);
	void *addr = base_alloc_impl(tsdn, base, alloc_size, alignment, &esn,
	    NULL);
	if (addr == NULL) {
		edata_avail_insert(&base->edata_avail, edata);
		return NULL;
	}

	/* Set is_reused: see comments in base_edata_is_reused. */
	edata_binit(edata, addr, alloc_size, esn, true /* is_reused */);
	*(edata_t **)addr = edata;

	return (byte_t *)addr + header_size;
}